

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int jsonParseAddNode(JsonParse *pParse,u32 eType,u32 n,char *zContent)

{
  uint uVar1;
  u32 uVar2;
  int iVar3;
  JsonNode *pJVar4;
  
  uVar1 = pParse->nNode;
  if (uVar1 < pParse->nAlloc) {
    pJVar4 = pParse->aNode;
    pJVar4[uVar1].eType = (u8)eType;
    pJVar4[uVar1].jnFlags = '\0';
    pJVar4[uVar1].n = n;
    pJVar4[uVar1].u.zJContent = zContent;
    uVar2 = pParse->nNode;
    pParse->nNode = uVar2 + 1;
    return uVar2;
  }
  if (pParse->oom == '\0') {
    uVar1 = pParse->nAlloc * 2 + 10;
    pJVar4 = (JsonNode *)sqlite3_realloc64(pParse->aNode,(ulong)uVar1 << 4);
    if (pJVar4 != (JsonNode *)0x0) {
      pParse->nAlloc = uVar1;
      pParse->aNode = pJVar4;
      iVar3 = jsonParseAddNode(pParse,eType,n,zContent);
      return iVar3;
    }
    pParse->oom = '\x01';
  }
  return -1;
}

Assistant:

static int jsonParseAddNode(
  JsonParse *pParse,        /* Append the node to this object */
  u32 eType,                /* Node type */
  u32 n,                    /* Content size or sub-node count */
  const char *zContent      /* Content */
){
  JsonNode *p;
  if( pParse->nNode>=pParse->nAlloc ){
    return jsonParseAddNodeExpand(pParse, eType, n, zContent);
  }
  p = &pParse->aNode[pParse->nNode];
  p->eType = (u8)eType;
  p->jnFlags = 0;
  p->n = n;
  p->u.zJContent = zContent;
  return pParse->nNode++;
}